

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctcp.c
# Opt level: O2

int nn_ctcp_create(nn_ep *ep)

{
  int iVar1;
  nn_fsm *self;
  char *__s;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  nn_ctx *ctx;
  char *pcVar5;
  undefined8 uVar6;
  int reconnect_ivl_max;
  int ipv4only;
  int reconnect_ivl;
  size_t local_c8;
  size_t sslen;
  size_t ipv4onlylen;
  sockaddr_storage ss;
  
  self = (nn_fsm *)nn_alloc_(0x9b8);
  if (self == (nn_fsm *)0x0) {
    nn_backtrace_print();
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/tcp/ctcp.c"
            ,0x84);
  }
  else {
    self[1].shutdown_fn = (nn_fsm_fn)ep;
    nn_ep_tran_setup(ep,&nn_ctcp_ep_ops,self);
    ipv4onlylen = 4;
    nn_ep_getopt(ep,0,0xe,&ipv4only,&ipv4onlylen);
    if (ipv4onlylen == 4) {
      __s = nn_ep_getaddr(ep);
      pcVar2 = strchr(__s,0x3b);
      pcVar5 = pcVar2 + 1;
      if (pcVar2 == (char *)0x0) {
        pcVar5 = __s;
      }
      pcVar3 = strrchr(__s,0x3a);
      if (pcVar3 == (char *)0x0) {
LAB_0012f5f6:
        nn_free(self);
        return -0x16;
      }
      sVar4 = strlen(__s);
      iVar1 = nn_port_resolve(pcVar3 + 1,(size_t)(__s + ~(ulong)pcVar3 + sVar4));
      if (iVar1 < 0) goto LAB_0012f5f6;
      iVar1 = nn_dns_check_hostname(pcVar5,(long)pcVar3 - (long)pcVar5);
      if ((iVar1 < 0) &&
         (iVar1 = nn_literal_resolve(pcVar5,(long)pcVar3 - (long)pcVar5,ipv4only,&ss,&sslen),
         iVar1 < 0)) goto LAB_0012f5f6;
      if ((pcVar2 != (char *)0x0) &&
         (iVar1 = nn_iface_resolve(__s,(long)pcVar2 - (long)__s,ipv4only,&ss,&sslen), iVar1 < 0)) {
        nn_free(self);
        return -0x13;
      }
      ctx = nn_ep_getctx(ep);
      nn_fsm_init_root(self,nn_ctcp_handler,nn_ctcp_shutdown,ctx);
      *(undefined4 *)&self[1].fn = 1;
      nn_usock_init((nn_usock *)&self[1].state,1,self);
      local_c8 = 4;
      nn_ep_getopt(ep,0,6,&reconnect_ivl,&local_c8);
      if (local_c8 == 4) {
        nn_ep_getopt(ep,0,7,&reconnect_ivl_max,&local_c8);
        if (local_c8 == 4) {
          if (reconnect_ivl_max == 0) {
            reconnect_ivl_max = reconnect_ivl;
          }
          nn_backoff_init((nn_backoff *)&self[8].shutdown_fn,2,reconnect_ivl,reconnect_ivl_max,self)
          ;
          nn_stcp_init((nn_stcp *)&self[10].stopped.item,4,ep,self);
          nn_dns_init((nn_dns *)&self[0x16].owner,3,self);
          nn_fsm_start(self);
          return 0;
        }
        nn_backtrace_print();
        pcVar5 = "sz == sizeof (reconnect_ivl_max)";
        uVar6 = 0xbf;
      }
      else {
        nn_backtrace_print();
        pcVar5 = "sz == sizeof (reconnect_ivl)";
        uVar6 = 0xbb;
      }
    }
    else {
      nn_backtrace_print();
      pcVar5 = "ipv4onlylen == sizeof (ipv4only)";
      uVar6 = 0x8d;
    }
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar5,
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/tcp/ctcp.c"
            ,uVar6);
  }
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

int nn_ctcp_create (struct nn_ep *ep)
{
    int rc;
    const char *addr;
    size_t addrlen;
    const char *semicolon;
    const char *hostname;
    const char *colon;
    const char *end;
    struct sockaddr_storage ss;
    size_t sslen;
    int ipv4only;
    size_t ipv4onlylen;
    struct nn_ctcp *self;
    int reconnect_ivl;
    int reconnect_ivl_max;
    size_t sz;

    /*  Allocate the new endpoint object. */
    self = nn_alloc (sizeof (struct nn_ctcp), "ctcp");
    alloc_assert (self);

    /*  Initalise the endpoint. */
    self->ep = ep;
    nn_ep_tran_setup (ep, &nn_ctcp_ep_ops, self);

    /*  Check whether IPv6 is to be used. */
    ipv4onlylen = sizeof (ipv4only);
    nn_ep_getopt (ep, NN_SOL_SOCKET, NN_IPV4ONLY, &ipv4only, &ipv4onlylen);
    nn_assert (ipv4onlylen == sizeof (ipv4only));

    /*  Start parsing the address. */
    addr = nn_ep_getaddr (ep);
    addrlen = strlen (addr);
    semicolon = strchr (addr, ';');
    hostname = semicolon ? semicolon + 1 : addr;
    colon = strrchr (addr, ':');
    end = addr + addrlen;

    /*  Parse the port. */
    if (!colon) {
        nn_free (self);
        return -EINVAL;
    }
    rc = nn_port_resolve (colon + 1, end - colon - 1);
    if (rc < 0) {
        nn_free (self);
        return -EINVAL;
    }

    /*  Check whether the host portion of the address is either a literal
        or a valid hostname. */
    if (nn_dns_check_hostname (hostname, colon - hostname) < 0 &&
          nn_literal_resolve (hostname, colon - hostname, ipv4only,
          &ss, &sslen) < 0) {
        nn_free (self);
        return -EINVAL;
    }

    /*  If local address is specified, check whether it is valid. */
    if (semicolon) {
        rc = nn_iface_resolve (addr, semicolon - addr, ipv4only, &ss, &sslen);
        if (rc < 0) {
            nn_free (self);
            return -ENODEV;
        }
    }

    /*  Initialise the structure. */
    nn_fsm_init_root (&self->fsm, nn_ctcp_handler, nn_ctcp_shutdown,
        nn_ep_getctx (ep));
    self->state = NN_CTCP_STATE_IDLE;
    nn_usock_init (&self->usock, NN_CTCP_SRC_USOCK, &self->fsm);
    sz = sizeof (reconnect_ivl);
    nn_ep_getopt (ep, NN_SOL_SOCKET, NN_RECONNECT_IVL, &reconnect_ivl, &sz);
    nn_assert (sz == sizeof (reconnect_ivl));
    sz = sizeof (reconnect_ivl_max);
    nn_ep_getopt (ep, NN_SOL_SOCKET, NN_RECONNECT_IVL_MAX,
        &reconnect_ivl_max, &sz);
    nn_assert (sz == sizeof (reconnect_ivl_max));
    if (reconnect_ivl_max == 0)
        reconnect_ivl_max = reconnect_ivl;
    nn_backoff_init (&self->retry, NN_CTCP_SRC_RECONNECT_TIMER,
        reconnect_ivl, reconnect_ivl_max, &self->fsm);
    nn_stcp_init (&self->stcp, NN_CTCP_SRC_STCP, ep, &self->fsm);
    nn_dns_init (&self->dns, NN_CTCP_SRC_DNS, &self->fsm);

    /*  Start the state machine. */
    nn_fsm_start (&self->fsm);

    return 0;
}